

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O1

int inflateReset2(z_stream *strm,int32_t windowBits)

{
  internal_state *piVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = inflateStateCheck(strm);
  if (iVar2 == 0) {
    piVar1 = strm->state;
    if (windowBits < 0) {
      if (windowBits < -0xf) {
        return -2;
      }
      iVar2 = 0;
      uVar3 = -windowBits;
    }
    else {
      iVar2 = ((uint)windowBits >> 4) + 5;
      uVar3 = windowBits & 0xf;
      if (0x2f < windowBits) {
        uVar3 = windowBits;
      }
    }
    if ((uVar3 - 8 < 8) || (uVar3 == 0)) {
      *(int *)&piVar1->pending_out = iVar2;
      piVar1->reproducible = uVar3;
      iVar2 = inflateReset(strm);
      return iVar2;
    }
  }
  return -2;
}

Assistant:

int32_t Z_EXPORT PREFIX(inflateReset2)(PREFIX3(stream) *strm, int32_t windowBits) {
    int wrap;
    struct inflate_state *state;

    /* get the state */
    if (inflateStateCheck(strm))
        return Z_STREAM_ERROR;
    state = (struct inflate_state *)strm->state;

    /* extract wrap request from windowBits parameter */
    if (windowBits < 0) {
        wrap = 0;
        if (windowBits < -MAX_WBITS)
            return Z_STREAM_ERROR;
        windowBits = -windowBits;
    } else {
        wrap = (windowBits >> 4) + 5;
#ifdef GUNZIP
        if (windowBits < 48)
            windowBits &= MAX_WBITS;
#endif
    }

    /* set number of window bits */
    if (windowBits && (windowBits < MIN_WBITS || windowBits > MAX_WBITS))
        return Z_STREAM_ERROR;

    /* update state and reset the rest of it */
    state->wrap = wrap;
    state->wbits = (unsigned)windowBits;
    return PREFIX(inflateReset)(strm);
}